

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O0

bool __thiscall rw::Texture::streamWrite(Texture *this,Stream *stream)

{
  uint32 size_00;
  uint uVar1;
  size_t sVar2;
  uint32 local_4c;
  char local_48 [4];
  uint32 filterAddressing;
  char buf [36];
  int size;
  Stream *stream_local;
  Texture *this_local;
  
  size_00 = streamGetSize(this);
  writeChunkHeader(stream,6,size_00);
  writeChunkHeader(stream,1,4);
  local_4c = this->filterAddressing;
  if ((this->raster != (Raster *)0x0) && ((this->raster->format & 0x1000U) == 0)) {
    local_4c = local_4c | 0x10000;
  }
  Stream::writeU32(stream,local_4c);
  memset(local_48,0,0x24);
  strncpy(local_48,this->name,0x20);
  sVar2 = strlen(local_48);
  uVar1 = (int)sVar2 + 4U & 0xfffffffc;
  writeChunkHeader(stream,2,uVar1);
  (*stream->_vptr_Stream[3])(stream,local_48,(ulong)uVar1);
  memset(local_48,0,0x24);
  strncpy(local_48,this->mask,0x20);
  sVar2 = strlen(local_48);
  uVar1 = (int)sVar2 + 4U & 0xfffffffc;
  writeChunkHeader(stream,2,uVar1);
  (*stream->_vptr_Stream[3])(stream,local_48,(ulong)uVar1);
  PluginList::streamWrite((PluginList *)&s_plglist,stream,this);
  return true;
}

Assistant:

bool
Texture::streamWrite(Stream *stream)
{
	int size;
	char buf[36];
	writeChunkHeader(stream, ID_TEXTURE, this->streamGetSize());
	writeChunkHeader(stream, ID_STRUCT, 4);
	uint32 filterAddressing = this->filterAddressing;
	if(this->raster && (raster->format & Raster::AUTOMIPMAP) == 0)
		filterAddressing |= 0x10000;
	stream->writeU32(filterAddressing);

	memset(buf, 0, 36);
	strncpy(buf, this->name, 32);
	size = strlen(buf)+4 & ~3;
	writeChunkHeader(stream, ID_STRING, size);
	stream->write8(buf, size);

	memset(buf, 0, 36);
	strncpy(buf, this->mask, 32);
	size = strlen(buf)+4 & ~3;
	writeChunkHeader(stream, ID_STRING, size);
	stream->write8(buf, size);

	s_plglist.streamWrite(stream, this);
	return true;
}